

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_inverted_1(void)

{
  run("falsey sections should have their contents rendered",
      "\"{{^boolean}}This should be rendered.{{/boolean}}\"","{\"boolean\": false}",(char *)0x0,
      "\"This should be rendered.\"");
  return;
}

Assistant:

static void
test_inverted_1(void)
{
    run(
        "falsey sections should have their contents rendered",
        "\"{{^boolean}}This should be rendered.{{/boolean}}\"",
        "{\"boolean\": false}",
        NULL,
        "\"This should be rendered.\""
    );
}